

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O1

char * Wlc_PrsReadName(Wlc_Prs_t *p,char *pStr,Vec_Int_t *vFanins)

{
  Wlc_Ntk_t *p_00;
  Wlc_Obj_t *pWVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *vFanins_00;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  int XValue;
  int Signed;
  int Range;
  int fFound;
  char Buffer [100];
  uint local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  char local_98 [104];
  
  pcVar8 = pStr + -1;
  do {
    pcVar9 = pcVar8;
    pcVar8 = pcVar9 + 1;
  } while (pcVar9[1] == ' ');
  if (0xf5 < (byte)(pcVar9[1] - 0x3aU)) {
    local_a8 = 0;
    vFanins_00 = (Vec_Int_t *)malloc(0x10);
    vFanins_00->nCap = 0;
    vFanins_00->nSize = 0;
    vFanins_00->pArray = (int *)0x0;
    pcVar7 = Wlc_PrsReadConstant(p,pcVar8,vFanins_00,&local_a0,&local_a4,(int *)&local_a8);
    if (pcVar7 == (char *)0x0) {
      if (vFanins_00->pArray != (int *)0x0) {
        free(vFanins_00->pArray);
        vFanins_00->pArray = (int *)0x0;
      }
      free(vFanins_00);
      bVar10 = false;
    }
    else {
      uVar4 = Wlc_ObjAlloc(p->pNtk,6,local_a4,local_a0 + -1,0);
      if (((int)uVar4 < 1) || (p_00 = p->pNtk, p_00->nObjsAlloc <= (int)uVar4)) {
LAB_003786e7:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      Wlc_ObjAddFanins(p_00,p_00->pObjs + uVar4,vFanins_00);
      if (p->pNtk->nObjsAlloc <= (int)uVar4) goto LAB_003786e7;
      pWVar1 = p->pNtk->pObjs;
      *(ushort *)(pWVar1 + uVar4) =
           (ushort)*(undefined4 *)(pWVar1 + uVar4) & 0xf7ff | (ushort)((local_a8 & 1) << 0xb);
      if (vFanins_00->pArray != (int *)0x0) {
        free(vFanins_00->pArray);
        vFanins_00->pArray = (int *)0x0;
      }
      free(vFanins_00);
      p->nConsts = p->nConsts + 1;
      sprintf(local_98,"_c%d_");
      uVar5 = Abc_NamStrFindOrAdd(p->pNtk->pManName,local_98,&local_9c);
      pcVar8 = (char *)(ulong)uVar5;
      if (local_9c == 0) {
        bVar10 = true;
        if (uVar4 != uVar5) {
          __assert_fail("iObj == NameId",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadVer.c"
                        ,0x291,"char *Wlc_PrsReadName(Wlc_Prs_t *, char *, Vec_Int_t *)");
        }
      }
      else {
        bVar10 = false;
        Wlc_PrsWriteErrorMessage(p,pcVar7,"Name %s is already used.",local_98);
      }
    }
    iVar6 = (int)pcVar8;
    goto joined_r0x0037863c;
  }
  do {
    bVar3 = pcVar9[1];
    pcVar9 = pcVar9 + 1;
  } while (bVar3 == 0x20);
  if (((byte)(bVar3 - 0x30) < 10) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) {
    if (bVar3 != 0) goto LAB_00378596;
    pcVar8 = Wlc_PrsFindName::Buffer;
LAB_0037864c:
    *pcVar8 = 0;
    pcVar7 = pcVar9;
  }
  else {
    pcVar7 = (char *)0x0;
    if ((bVar3 - 0x24 < 0x3c) && ((0x900000000000001U >> ((ulong)(bVar3 - 0x24) & 0x3f) & 1) != 0))
    {
LAB_00378596:
      pcVar8 = Wlc_PrsFindName::Buffer;
      bVar10 = true;
      iVar6 = 0;
      do {
        if (((bVar10) && (9 < (byte)(bVar3 - 0x30))) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf))) {
          if (bVar3 != 0x24) {
            if (bVar3 == 0x5c) goto LAB_003785d8;
            if (bVar3 != 0x5f) break;
          }
LAB_003785de:
          bVar2 = !bVar10;
          bVar10 = true;
          if ((bVar2) && (bVar10 = false, bVar3 == 0x20)) {
            iVar6 = iVar6 + -1;
            bVar10 = iVar6 == 0;
          }
        }
        else {
          if (bVar3 != 0x5c) goto LAB_003785de;
LAB_003785d8:
          iVar6 = iVar6 + 1;
          bVar10 = false;
        }
        *pcVar8 = bVar3;
        pcVar8 = (char *)((byte *)pcVar8 + 1);
        bVar3 = pcVar9[1];
        pcVar9 = pcVar9 + 1;
      } while (bVar3 != 0);
      goto LAB_0037864c;
    }
  }
  iVar6 = (int)pcVar9;
  if (pcVar7 == (char *)0x0) {
    bVar10 = false;
    Wlc_PrsWriteErrorMessage(p,(char *)0x0,"Cannot read name in assign-statement.");
  }
  else {
    iVar6 = Abc_NamStrFindOrAdd(p->pNtk->pManName,Wlc_PrsFindName::Buffer,&local_9c);
    bVar10 = true;
    if (local_9c == 0) {
      bVar10 = false;
      Wlc_PrsWriteErrorMessage(p,pcVar7,"Name %s is used but not declared.",Wlc_PrsFindName::Buffer)
      ;
    }
  }
joined_r0x0037863c:
  if (bVar10) {
    Vec_IntPush(vFanins,iVar6);
    pcVar9 = pcVar7 + -1;
    do {
      pcVar8 = pcVar9 + 1;
      pcVar7 = pcVar9 + 1;
      pcVar9 = pcVar8;
    } while (*pcVar7 == ' ');
  }
  else {
    pcVar8 = (char *)0x0;
  }
  return pcVar8;
}

Assistant:

static inline char * Wlc_PrsReadName( Wlc_Prs_t * p, char * pStr, Vec_Int_t * vFanins )
{
    int NameId, fFound, iObj;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( Wlc_PrsIsDigit(pStr) )
    {
        char Buffer[100];
        int Range, Signed, XValue = 0;
        Vec_Int_t * vFanins = Vec_IntAlloc(0);
        pStr = Wlc_PrsReadConstant( p, pStr, vFanins, &Range, &Signed, &XValue );
        if ( pStr == NULL )
        {
            Vec_IntFree( vFanins );
            return 0;
        }
        // create new node
        iObj = Wlc_ObjAlloc( p->pNtk, WLC_OBJ_CONST, Signed, Range-1, 0 );
        Wlc_ObjAddFanins( p->pNtk, Wlc_NtkObj(p->pNtk, iObj), vFanins );
        Wlc_NtkObj(p->pNtk, iObj)->fXConst = XValue;
        Vec_IntFree( vFanins );
        // add node's name
        sprintf( Buffer, "_c%d_", p->nConsts++ );
        NameId = Abc_NamStrFindOrAdd( p->pNtk->pManName, Buffer, &fFound );
        if ( fFound )
            return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Name %s is already used.", Buffer );
        assert( iObj == NameId );
    }
    else
    {
        char * pName;
        pStr = Wlc_PrsFindName( pStr, &pName );
        if ( pStr == NULL )
            return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in assign-statement." );
        NameId = Abc_NamStrFindOrAdd( p->pNtk->pManName, pName, &fFound );
        if ( !fFound )
            return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Name %s is used but not declared.", pName );
    }
    Vec_IntPush( vFanins, NameId );
    return Wlc_PrsSkipSpaces( pStr );
}